

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O1

String * Rct::shortOptions(String *__return_storage_ptr__,option *longOptions)

{
  int iVar1;
  char **ppcVar2;
  long lVar3;
  char cVar4;
  option *poVar5;
  
  (__return_storage_ptr__->mString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mString).field_2;
  (__return_storage_ptr__->mString)._M_string_length = 0;
  (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  if (longOptions->name != (char *)0x0) {
    poVar5 = longOptions + 1;
    do {
      if (poVar5[-1].val != 0) {
        cVar4 = (char)__return_storage_ptr__;
        lVar3 = std::__cxx11::string::find(cVar4,(ulong)(uint)(int)(char)poVar5[-1].val);
        if (lVar3 != -1) {
          printf("%c (%s) is already used\n",(ulong)(uint)poVar5[-1].val,poVar5[-1].name);
          lVar3 = std::__cxx11::string::find(cVar4,(ulong)(uint)(int)(char)poVar5[-1].val);
          if (lVar3 != -1) {
            __assert_fail("!ret.contains(longOptions[i].val)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Rct.cpp"
                          ,0x9a,"String Rct::shortOptions(const option *)");
          }
        }
        std::__cxx11::string::push_back(cVar4);
        iVar1 = poVar5[-1].has_arg;
        if (iVar1 != 0) {
          if (iVar1 == 1) {
            std::__cxx11::string::push_back(cVar4);
          }
          else {
            if (iVar1 != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Rct.cpp"
                            ,0xa7,"String Rct::shortOptions(const option *)");
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__,0x177d0f);
          }
        }
      }
      ppcVar2 = &poVar5->name;
      poVar5 = poVar5 + 1;
    } while (*ppcVar2 != (char *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

String shortOptions(const option *longOptions)
{
    String ret;
    for (int i=0; longOptions[i].name; ++i) {
        if (longOptions[i].val) {
            if (ret.contains(longOptions[i].val)) {
                printf("%c (%s) is already used\n", longOptions[i].val, longOptions[i].name);
                assert(!ret.contains(longOptions[i].val));
            }
            ret.append(longOptions[i].val);
            switch (longOptions[i].has_arg) {
            case no_argument:
                break;
            case optional_argument:
                ret.append("::");
                break;
            case required_argument:
                ret.append(':');
                break;
            default:
                assert(0);
                break;
            }
        }
    }
#if 0
    String unused;
    for (char ch='a'; ch<='z'; ++ch) {
        if (!ret.contains(ch)) {
            unused.append(ch);
        }
        const char upper = toupper(ch);
        if (!ret.contains(upper)) {
            unused.append(upper);
        }
    }
    printf("Unused letters: %s\n", unused.nullTerminated());
#endif
    return ret;
}